

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3EvalSelectDeferred(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3TokenAndCost *aTC,int nTC)

{
  byte *pbVar1;
  Fts3PhraseToken *pFVar2;
  Fts3MultiSegReader *pCsr_00;
  byte *pbVar3;
  Fts3Table *pTab;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  Fts3DeferredToken *pFVar8;
  Mem *pVal;
  char *pBuf;
  long lVar9;
  Fts3TokenAndCost *pFVar10;
  byte *pbVar11;
  int iVar12;
  Fts3TokenAndCost *pFVar13;
  sqlite3_stmt *pStmt_00;
  char *pBuf_00;
  byte bVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  sqlite3_int64 nDoc;
  sqlite3_stmt *pStmt;
  Fts3Table *p;
  sqlite3_int64 nByte;
  ulong local_78;
  sqlite3_stmt *local_70;
  sqlite3_stmt *local_68;
  Fts3Table *local_60;
  uint local_54;
  Fts3Cursor *local_50;
  sqlite_int64 local_48;
  Fts3TokenAndCost *local_40;
  ulong local_38;
  
  local_60 = (Fts3Table *)(pCsr->base).pVtab;
  if (local_60->zContentTbl != (char *)0x0) {
    return 0;
  }
  if (nTC < 1) {
    return 0;
  }
  local_38 = (ulong)(uint)nTC;
  lVar9 = 0;
  iVar16 = 0;
  iVar12 = 0;
  do {
    if (*(Fts3Expr **)((long)&aTC->pRoot + lVar9) == pRoot) {
      iVar12 = iVar12 + *(int *)((long)&aTC->nOvfl + lVar9);
      iVar16 = iVar16 + 1;
    }
    lVar9 = lVar9 + 0x28;
  } while (local_38 * 0x28 != lVar9);
  if (iVar16 < 2 || iVar12 == 0) {
    return 0;
  }
  iVar12 = 0;
  local_70 = (sqlite3_stmt *)CONCAT44(local_70._4_4_,pCsr->nRowAvg);
  local_50 = pCsr;
  if (pCsr->nRowAvg == 0) {
    local_78 = 0;
    local_48 = 0;
    iVar12 = sqlite3Fts3SelectDoctotal(local_60,&local_68);
    pStmt_00 = local_68;
    if (iVar12 != 0) {
      return iVar12;
    }
    pVal = columnMem(local_68,0);
    pBuf = (char *)sqlite3_value_blob(pVal);
    columnMallocFailure(pStmt_00);
    iVar12 = sqlite3_column_bytes(pStmt_00,0);
    iVar6 = sqlite3Fts3GetVarint(pBuf,(sqlite_int64 *)&local_78);
    if (iVar6 < iVar12) {
      local_70 = pStmt_00;
      pBuf_00 = pBuf + iVar6;
      do {
        iVar6 = sqlite3Fts3GetVarint(pBuf_00,&local_48);
        pBuf_00 = pBuf_00 + iVar6;
      } while (pBuf_00 < pBuf + iVar12);
      pStmt_00 = local_70;
      if (local_48 != 0 && local_78 != 0) {
        pCsr->nDoc = local_78;
        pCsr->nRowAvg =
             (int)((local_48 / (long)local_78 + (long)local_60->nPgsz) / (long)local_60->nPgsz);
        iVar12 = sqlite3_reset(local_70);
        local_70 = (sqlite3_stmt *)CONCAT44(local_70._4_4_,pCsr->nRowAvg);
        goto LAB_001bdb86;
      }
    }
    sqlite3_reset(pStmt_00);
    iVar12 = 0x10b;
  }
  else {
LAB_001bdb86:
    if (iVar12 == 0) {
      local_54 = iVar16 - 1;
      iVar17 = 1;
      uVar18 = 0;
      iVar6 = 0;
      local_40 = aTC;
      do {
        pTab = local_60;
        if (nTC < 1) {
          pFVar13 = (Fts3TokenAndCost *)0x0;
        }
        else {
          pFVar13 = (Fts3TokenAndCost *)0x0;
          uVar7 = local_38;
          pFVar10 = aTC;
          do {
            if (((pFVar10->pToken != (Fts3PhraseToken *)0x0) && (pFVar10->pRoot == pRoot)) &&
               ((pFVar13 == (Fts3TokenAndCost *)0x0 || (pFVar10->nOvfl < pFVar13->nOvfl)))) {
              pFVar13 = pFVar10;
            }
            pFVar10 = pFVar10 + 1;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        if (uVar18 == 0) {
          iVar17 = iVar17 << 2;
LAB_001bdc4b:
          local_78 = local_78 & 0xffffffff00000000;
          local_68 = (sqlite3_stmt *)0x0;
          iVar12 = fts3TermSelect(local_60,pFVar13->pToken,pFVar13->iCol,(int *)&local_78,
                                  (char **)&local_68);
          if (iVar12 == 0) {
            iVar12 = fts3EvalPhraseMergeToken
                               (pTab,pFVar13->pPhrase,pFVar13->iToken,(char *)local_68,(int)local_78
                               );
            if (iVar12 == 0) {
              pbVar3 = (byte *)(pFVar13->pPhrase->doclist).aAll;
              iVar12 = 0;
              iVar5 = 0;
              if ((pbVar3 != (byte *)0x0) &&
                 (lVar9 = (long)(pFVar13->pPhrase->doclist).nAll, 0 < lVar9)) {
                iVar5 = 0;
                pbVar1 = pbVar3;
                do {
                  do {
                    pbVar11 = pbVar1;
                    pbVar1 = pbVar11 + 1;
                  } while ((char)*pbVar11 < '\0');
                  bVar14 = pbVar11[1];
                  if (bVar14 != 0) {
                    do {
                      pbVar1 = pbVar11 + 2;
                      bVar15 = bVar14 & 0x80;
                      pbVar11 = pbVar11 + 1;
                      bVar14 = *pbVar1;
                    } while (bVar15 != 0 || *pbVar1 != 0);
                  }
                  iVar5 = iVar5 + 1;
                  pbVar1 = pbVar11 + 2;
                } while (pbVar11 + 2 < pbVar3 + lVar9);
              }
              if (iVar5 < iVar6) {
                iVar6 = iVar5;
              }
              if (uVar18 == 0) {
                iVar6 = iVar5;
              }
            }
          }
        }
        else {
          iVar12 = iVar17 + 3;
          if (-1 < iVar17) {
            iVar12 = iVar17;
          }
          if (pFVar13->nOvfl < ((iVar6 + (iVar12 >> 2) + -1) / (iVar12 >> 2)) * (int)local_70) {
            if (uVar18 < 0xc) {
              iVar17 = iVar17 * 4;
            }
            iVar12 = 0;
            if (uVar18 != local_54 && 1 < pFVar13->pPhrase->nToken) goto LAB_001bdc4b;
          }
          else {
            pFVar2 = pFVar13->pToken;
            iVar5 = pFVar13->iCol;
            iVar4 = sqlite3_initialize();
            iVar12 = 7;
            if ((iVar4 == 0) &&
               (pFVar8 = (Fts3DeferredToken *)sqlite3Malloc(0x20),
               pFVar8 != (Fts3DeferredToken *)0x0)) {
              *(undefined8 *)&pFVar8->iCol = 0;
              pFVar8->pNext = (Fts3DeferredToken *)0x0;
              pFVar8->pList = (PendingList *)0x0;
              pFVar8->pToken = pFVar2;
              pFVar8->pNext = local_50->pDeferred;
              pFVar8->iCol = iVar5;
              local_50->pDeferred = pFVar8;
              pFVar2->pDeferred = pFVar8;
              iVar12 = 0;
            }
            pCsr_00 = pFVar2->pSegcsr;
            sqlite3Fts3SegReaderFinish(pCsr_00);
            sqlite3_free(pCsr_00);
            pFVar2->pSegcsr = (Fts3MultiSegReader *)0x0;
            aTC = local_40;
          }
        }
        pFVar13->pToken = (Fts3PhraseToken *)0x0;
        uVar18 = uVar18 + 1;
      } while (((int)uVar18 < iVar16) && (iVar12 == 0));
    }
  }
  return iVar12;
}

Assistant:

static int fts3EvalSelectDeferred(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Consider tokens with this root node */
  Fts3TokenAndCost *aTC,          /* Array of expression tokens and costs */
  int nTC                         /* Number of entries in aTC[] */
){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int nDocSize = 0;               /* Number of pages per doc loaded */
  int rc = SQLITE_OK;             /* Return code */
  int ii;                         /* Iterator variable for various purposes */
  int nOvfl = 0;                  /* Total overflow pages used by doclists */
  int nToken = 0;                 /* Total number of tokens in cluster */

  int nMinEst = 0;                /* The minimum count for any phrase so far. */
  int nLoad4 = 1;                 /* (Phrases that will be loaded)^4. */

  /* Tokens are never deferred for FTS tables created using the content=xxx
  ** option. The reason being that it is not guaranteed that the content
  ** table actually contains the same data as the index. To prevent this from
  ** causing any problems, the deferred token optimization is completely
  ** disabled for content=xxx tables. */
  if( pTab->zContentTbl ){
    return SQLITE_OK;
  }

  /* Count the tokens in this AND/NEAR cluster. If none of the doclists
  ** associated with the tokens spill onto overflow pages, or if there is
  ** only 1 token, exit early. No tokens to defer in this case. */
  for(ii=0; ii<nTC; ii++){
    if( aTC[ii].pRoot==pRoot ){
      nOvfl += aTC[ii].nOvfl;
      nToken++;
    }
  }
  if( nOvfl==0 || nToken<2 ) return SQLITE_OK;

  /* Obtain the average docsize (in pages). */
  rc = fts3EvalAverageDocsize(pCsr, &nDocSize);
  assert( rc!=SQLITE_OK || nDocSize>0 );


  /* Iterate through all tokens in this AND/NEAR cluster, in ascending order 
  ** of the number of overflow pages that will be loaded by the pager layer 
  ** to retrieve the entire doclist for the token from the full-text index.
  ** Load the doclists for tokens that are either:
  **
  **   a. The cheapest token in the entire query (i.e. the one visited by the
  **      first iteration of this loop), or
  **
  **   b. Part of a multi-token phrase.
  **
  ** After each token doclist is loaded, merge it with the others from the
  ** same phrase and count the number of documents that the merged doclist
  ** contains. Set variable "nMinEst" to the smallest number of documents in 
  ** any phrase doclist for which 1 or more token doclists have been loaded.
  ** Let nOther be the number of other phrases for which it is certain that
  ** one or more tokens will not be deferred.
  **
  ** Then, for each token, defer it if loading the doclist would result in
  ** loading N or more overflow pages into memory, where N is computed as:
  **
  **    (nMinEst + 4^nOther - 1) / (4^nOther)
  */
  for(ii=0; ii<nToken && rc==SQLITE_OK; ii++){
    int iTC;                      /* Used to iterate through aTC[] array. */
    Fts3TokenAndCost *pTC = 0;    /* Set to cheapest remaining token. */

    /* Set pTC to point to the cheapest remaining token. */
    for(iTC=0; iTC<nTC; iTC++){
      if( aTC[iTC].pToken && aTC[iTC].pRoot==pRoot 
       && (!pTC || aTC[iTC].nOvfl<pTC->nOvfl) 
      ){
        pTC = &aTC[iTC];
      }
    }
    assert( pTC );

    if( ii && pTC->nOvfl>=((nMinEst+(nLoad4/4)-1)/(nLoad4/4))*nDocSize ){
      /* The number of overflow pages to load for this (and therefore all
      ** subsequent) tokens is greater than the estimated number of pages 
      ** that will be loaded if all subsequent tokens are deferred.
      */
      Fts3PhraseToken *pToken = pTC->pToken;
      rc = sqlite3Fts3DeferToken(pCsr, pToken, pTC->iCol);
      fts3SegReaderCursorFree(pToken->pSegcsr);
      pToken->pSegcsr = 0;
    }else{
      /* Set nLoad4 to the value of (4^nOther) for the next iteration of the
      ** for-loop. Except, limit the value to 2^24 to prevent it from 
      ** overflowing the 32-bit integer it is stored in. */
      if( ii<12 ) nLoad4 = nLoad4*4;

      if( ii==0 || (pTC->pPhrase->nToken>1 && ii!=nToken-1) ){
        /* Either this is the cheapest token in the entire query, or it is
        ** part of a multi-token phrase. Either way, the entire doclist will
        ** (eventually) be loaded into memory. It may as well be now. */
        Fts3PhraseToken *pToken = pTC->pToken;
        int nList = 0;
        char *pList = 0;
        rc = fts3TermSelect(pTab, pToken, pTC->iCol, &nList, &pList);
        assert( rc==SQLITE_OK || pList==0 );
        if( rc==SQLITE_OK ){
          rc = fts3EvalPhraseMergeToken(
              pTab, pTC->pPhrase, pTC->iToken,pList,nList
          );
        }
        if( rc==SQLITE_OK ){
          int nCount;
          nCount = fts3DoclistCountDocids(
              pTC->pPhrase->doclist.aAll, pTC->pPhrase->doclist.nAll
          );
          if( ii==0 || nCount<nMinEst ) nMinEst = nCount;
        }
      }
    }
    pTC->pToken = 0;
  }

  return rc;
}